

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O2

shared_ptr<chrono::ChMarker> __thiscall
chrono::ChAssembly::SearchMarker(ChAssembly *this,int markID)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<chrono::ChBody> *body;
  long *plVar3;
  shared_ptr<chrono::ChMarker> sVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  plVar1 = *(long **)(CONCAT44(in_register_00000034,markID) + 0x80);
  _Var2._M_pi = in_RDX;
  for (plVar3 = *(long **)(CONCAT44(in_register_00000034,markID) + 0x78); plVar3 != plVar1;
      plVar3 = plVar3 + 2) {
    sVar4 = ChContainerSearchFromID<std::shared_ptr<chrono::ChMarker>,__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChMarker>const*,std::vector<std::shared_ptr<chrono::ChMarker>,std::allocator<std::shared_ptr<chrono::ChMarker>>>>>
                      ((chrono *)this,(int)in_RDX,
                       *(shared_ptr<chrono::ChMarker> **)(*plVar3 + 0x1b0),
                       *(shared_ptr<chrono::ChMarker> **)(*plVar3 + 0x1b8));
    _Var2 = sVar4.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if ((this->super_ChPhysicsItem).super_ChObj._vptr_ChObj != (_func_int **)0x0) goto LAB_00a86e5e;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_ChPhysicsItem).super_ChObj.m_name);
    _Var2._M_pi = extraout_RDX;
  }
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)0x0;
  (this->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus._M_p = (pointer)0x0;
LAB_00a86e5e:
  sVar4.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar4.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChMarker>)
         sVar4.super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChMarker> ChAssembly::SearchMarker(int markID) {
    // Iterate over all bodies and search in the body's marker list
    for (auto& body : bodylist) {
        if (auto res = ChContainerSearchFromID<std::shared_ptr<ChMarker>,
                                               std::vector<std::shared_ptr<ChMarker>>::const_iterator>(
                markID, body->GetMarkerList().begin(), body->GetMarkerList().end()))
            return res;
    }

    return (std::shared_ptr<ChMarker>());  // not found; return an empty shared_ptr
}